

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::objectivec::BuildCommentsString_abi_cxx11_
          (string *__return_storage_ptr__,objectivec *this,SourceLocation *location,
          bool prefer_single_line)

{
  pointer pbVar1;
  char *__lhs;
  undefined1 in_R9B;
  ulong uVar2;
  StringPiece full;
  allocator local_159;
  string *local_158;
  allocator local_149;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lines;
  long local_128;
  string prefix;
  string suffix;
  StringPiece local_e0;
  string local_d0;
  string local_b0;
  string epilogue;
  string local_70;
  string line;
  
  lines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  lines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  lines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_158 = __return_storage_ptr__;
  stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>
            (&local_e0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (this + (ulong)(*(long *)(this + 0x18) == 0) * 0x20 + 0x10));
  full.length_ = (size_type)"\n";
  full.ptr_ = (char *)local_e0.length_;
  Split_abi_cxx11_((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&prefix,(protobuf *)local_e0.ptr_,full,(char *)0x0,(bool)in_R9B);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_move_assign(&lines);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&prefix);
  do {
    if (lines.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        lines.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::__cxx11::string::string((string *)local_158,"",(allocator *)&prefix);
LAB_002af4bd:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&lines);
      return local_158;
    }
    if (lines.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish[-1]._M_string_length != 0) {
      prefix._M_dataplus._M_p = (pointer)&prefix.field_2;
      prefix._M_string_length = 0;
      suffix._M_dataplus._M_p = (pointer)&suffix.field_2;
      suffix._M_string_length = 0;
      prefix.field_2._M_local_buf[0] = '\0';
      (local_158->_M_dataplus)._M_p = (pointer)&local_158->field_2;
      local_158->_M_string_length = 0;
      epilogue._M_dataplus._M_p = (pointer)&epilogue.field_2;
      epilogue._M_string_length = 0;
      suffix.field_2._M_local_buf[0] = '\0';
      (local_158->field_2)._M_local_buf[0] = '\0';
      epilogue.field_2._M_local_buf[0] = '\0';
      if ((char)location == '\x01' &&
          (long)lines.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)lines.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start == 0x20) {
        std::__cxx11::string::assign((char *)&prefix);
        std::__cxx11::string::assign((char *)&suffix);
        __lhs = "";
      }
      else {
        std::__cxx11::string::assign((char *)&prefix);
        std::__cxx11::string::assign((char *)&suffix);
        std::__cxx11::string::append((char *)local_158);
        std::__cxx11::string::assign((char *)&epilogue);
        __lhs = " ";
      }
      local_128 = 0;
      for (uVar2 = 0;
          pbVar1 = lines.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
          uVar2 < (ulong)((long)lines.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)lines.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 5); uVar2 = uVar2 + 1)
      {
        std::__cxx11::string::string((string *)&local_70," ",(allocator *)&local_b0);
        StripPrefixString(&line,(string *)((long)&(pbVar1->_M_dataplus)._M_p + local_128),&local_70)
        ;
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::string((string *)&local_b0,"\\",&local_149);
        std::__cxx11::string::string((string *)&local_d0,"\\\\",&local_159);
        StringReplace(&local_70,&line,&local_b0,&local_d0,true);
        std::__cxx11::string::operator=((string *)&line,(string *)&local_70);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_d0);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::string((string *)&local_b0,"@",&local_149);
        std::__cxx11::string::string((string *)&local_d0,"\\@",&local_159);
        StringReplace(&local_70,&line,&local_b0,&local_d0,true);
        std::__cxx11::string::operator=((string *)&line,(string *)&local_70);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_d0);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::string((string *)&local_b0,"/*",&local_149);
        std::__cxx11::string::string((string *)&local_d0,"/\\*",&local_159);
        StringReplace(&local_70,&line,&local_b0,&local_d0,true);
        std::__cxx11::string::operator=((string *)&line,(string *)&local_70);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_d0);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::string((string *)&local_b0,"*/",&local_149);
        std::__cxx11::string::string((string *)&local_d0,"*\\/",&local_159);
        StringReplace(&local_70,&line,&local_b0,&local_d0,true);
        std::__cxx11::string::operator=((string *)&line,(string *)&local_70);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_d0);
        std::__cxx11::string::~string((string *)&local_b0);
        std::operator+(&local_70,&prefix,&line);
        std::__cxx11::string::operator=((string *)&line,(string *)&local_70);
        std::__cxx11::string::~string((string *)&local_70);
        StripWhitespace(&line);
        std::operator+(&local_70,__lhs,&line);
        std::__cxx11::string::operator=((string *)&line,(string *)&local_70);
        std::__cxx11::string::~string((string *)&local_70);
        std::operator+(&local_70,&line,&suffix);
        std::__cxx11::string::append((string *)local_158);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&line);
        local_128 = local_128 + 0x20;
      }
      std::__cxx11::string::append((string *)local_158);
      std::__cxx11::string::~string((string *)&epilogue);
      std::__cxx11::string::~string((string *)&suffix);
      std::__cxx11::string::~string((string *)&prefix);
      goto LAB_002af4bd;
    }
    lines.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         lines.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish + -1;
    std::__cxx11::string::~string
              ((string *)
               lines.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  } while( true );
}

Assistant:

std::string BuildCommentsString(const SourceLocation& location,
                           bool prefer_single_line) {
  const std::string& comments = location.leading_comments.empty()
                               ? location.trailing_comments
                               : location.leading_comments;
  std::vector<std::string> lines;
  lines = Split(comments, "\n", false);
  while (!lines.empty() && lines.back().empty()) {
    lines.pop_back();
  }
  // If there are no comments, just return an empty string.
  if (lines.empty()) {
    return "";
  }

  std::string prefix;
  std::string suffix;
  std::string final_comments;
  std::string epilogue;

  bool add_leading_space = false;

  if (prefer_single_line && lines.size() == 1) {
    prefix = "/** ";
    suffix = " */\n";
  } else {
    prefix = "* ";
    suffix = "\n";
    final_comments += "/**\n";
    epilogue = " **/\n";
    add_leading_space = true;
  }

  for (int i = 0; i < lines.size(); i++) {
    std::string line = StripPrefixString(lines[i], " ");
    // HeaderDoc and appledoc use '\' and '@' for markers; escape them.
    line = StringReplace(line, "\\", "\\\\", true);
    line = StringReplace(line, "@", "\\@", true);
    // Decouple / from * to not have inline comments inside comments.
    line = StringReplace(line, "/*", "/\\*", true);
    line = StringReplace(line, "*/", "*\\/", true);
    line = prefix + line;
    StripWhitespace(&line);
    // If not a one line, need to add the first space before *, as
    // StripWhitespace would have removed it.
    line = (add_leading_space ? " " : "") + line;
    final_comments += line + suffix;
  }
  final_comments += epilogue;
  return final_comments;
}